

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void list_set_and_clear(Am_Object *inter,Am_Object *old_object,Am_Object *new_object,
                       Am_Object *ref_object)

{
  bool bVar1;
  Am_Value *pAVar2;
  int local_70;
  int local_6c;
  int i_1;
  int i;
  int stopErase;
  int startErase;
  int stopSet;
  int startSet;
  Am_Object current;
  Am_Object local_40;
  undefined1 local_38 [8];
  Am_Value_List all_objects;
  Am_Object *ref_object_local;
  Am_Object *new_object_local;
  Am_Object *old_object_local;
  Am_Object *inter_local;
  
  all_objects.item = (Am_List_Item *)ref_object;
  Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&local_40,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_38,pAVar2);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object((Am_Object *)&stopSet);
  calc_ranks(&startErase,&stopErase,&i,&i_1,old_object,new_object,(Am_Object *)all_objects.item);
  if (i != -1) {
    Am_Value_List::Start((Am_Value_List *)local_38);
    for (local_6c = 0; local_6c < i; local_6c = local_6c + 1) {
      Am_Value_List::Next((Am_Value_List *)local_38);
    }
    for (; local_6c <= i_1; local_6c = local_6c + 1) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_38);
      Am_Object::operator=((Am_Object *)&stopSet,pAVar2);
      Am_Object::Set((Am_Object *)&stopSet,0x172,false,1);
      Am_Value_List::Next((Am_Value_List *)local_38);
    }
  }
  if (startErase != -1) {
    Am_Value_List::Start((Am_Value_List *)local_38);
    for (local_70 = 0; local_70 < startErase; local_70 = local_70 + 1) {
      Am_Value_List::Next((Am_Value_List *)local_38);
    }
    for (; local_70 <= stopErase; local_70 = local_70 + 1) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_38);
      Am_Object::operator=((Am_Object *)&stopSet,pAVar2);
      pAVar2 = Am_Object::Get((Am_Object *)&stopSet,0xcc,0);
      bVar1 = Am_Value::Valid(pAVar2);
      if (bVar1) {
        Am_Object::Set((Am_Object *)&stopSet,0x172,true,1);
      }
      Am_Value_List::Next((Am_Value_List *)local_38);
    }
  }
  Am_Object::~Am_Object((Am_Object *)&stopSet);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_38);
  return;
}

Assistant:

void
list_set_and_clear(Am_Object &inter, Am_Object &old_object,
                   Am_Object &new_object, Am_Object &ref_object)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, old_object, new_object,
             ref_object);
  if (startErase != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startErase; all_objects.Next(), i++)
      ;
    for (; i <= stopErase; all_objects.Next(), i++) {
      current = all_objects.Get();
      Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
      current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  }
  if (startSet != -1) {
    int i;
    for (all_objects.Start(), i = 0; i < startSet; all_objects.Next(), i++)
      ;
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, true);
        current.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    }
  }
}